

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

uint64_t kratos::hash_generator(Generator *generator)

{
  size_type sVar1;
  bool bVar2;
  uint64_t uVar3;
  size_type sVar4;
  undefined1 local_a0 [8];
  HashVisitor hash_visitor;
  
  bVar2 = Context::is_unique(generator->context_,generator);
  if (bVar2) {
    uVar3 = 0xcbf29ce484222325;
    sVar1 = (generator->name)._M_string_length;
    if (sVar1 == 0) {
      uVar3 = 0xcbf29ce484222325;
    }
    else {
      sVar4 = 0;
      do {
        uVar3 = ((byte)(generator->name)._M_dataplus._M_p[sVar4] ^ uVar3) * 0x100000001b3;
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
  }
  else {
    HashVisitor::HashVisitor((HashVisitor *)local_a0,generator);
    IRVisitor::visit_root((IRVisitor *)local_a0,&generator->super_IRNode);
    uVar3 = HashVisitor::produce_hash((HashVisitor *)local_a0);
    local_a0 = (undefined1  [8])&PTR_visit_root_002a9348;
    if (hash_visitor.var_hashes_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(hash_visitor.var_hashes_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)hash_visitor.stmt_hashes_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)hash_visitor.var_hashes_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (hash_visitor.super_IRVisitor.visited_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      operator_delete(hash_visitor.super_IRVisitor.visited_._M_h._M_single_bucket,
                      (long)hash_visitor.var_hashes_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)hash_visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
    }
    local_a0 = (undefined1  [8])&PTR_visit_root_002a8ae0;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&hash_visitor.super_IRVisitor.level);
  }
  return uVar3;
}

Assistant:

uint64_t hash_generator(Generator* generator) {
    // if it's unique, just has the name
    if (generator->context()->is_unique(generator)) {
        return hash_64_fnv1a(generator->name.c_str(), generator->name.size());
    }
    // we use a visitor to compute all the hashes
    HashVisitor hash_visitor(generator);
    hash_visitor.visit_root(generator);
    return hash_visitor.produce_hash();
}